

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O1

void __thiscall
SQLexer::Init(SQLexer *this,SQSharedState *ss,SQLEXREADFUNC rg,SQUserPointer up,
             CompilerErrorFunc efunc,void *ed)

{
  SQUnsignedInteger *pSVar1;
  SQTable *pSVar2;
  SQInteger SVar3;
  SQObjectPtr local_50;
  SQObjectPtr local_40;
  
  this->_errfunc = efunc;
  this->_errtarget = ed;
  this->_sharedstate = ss;
  pSVar2 = (SQTable *)sq_vm_malloc(0x58);
  SQTable::SQTable(pSVar2,ss,0x25);
  (pSVar2->super_SQDelegable)._delegate = (SQTable *)0x0;
  this->_keywords = pSVar2;
  local_50.super_SQObject._unVal.pString = SQString::Create(ss,"while",-1);
  local_50.super_SQObject._type = OT_STRING;
  if (local_50.super_SQObject._unVal.pTable != (SQTable *)0x0) {
    pSVar1 = &((local_50.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    local_40.super_SQObject._type = OT_INTEGER;
    local_40.super_SQObject._unVal.nInteger = 0x112;
    SQTable::NewSlot(pSVar2,&local_50,&local_40);
    SQObjectPtr::~SQObjectPtr(&local_40);
    SQObjectPtr::~SQObjectPtr(&local_50);
    pSVar2 = this->_keywords;
    local_50.super_SQObject._unVal.pString = SQString::Create(ss,"do",-1);
    local_50.super_SQObject._type = OT_STRING;
    if (local_50.super_SQObject._unVal.pTable != (SQTable *)0x0) {
      pSVar1 = &((local_50.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      local_40.super_SQObject._type = OT_INTEGER;
      local_40.super_SQObject._unVal.nInteger = 0x115;
      SQTable::NewSlot(pSVar2,&local_50,&local_40);
      SQObjectPtr::~SQObjectPtr(&local_40);
      SQObjectPtr::~SQObjectPtr(&local_50);
      pSVar2 = this->_keywords;
      local_50.super_SQObject._unVal.pString = SQString::Create(ss,"if",-1);
      local_50.super_SQObject._type = OT_STRING;
      if (local_50.super_SQObject._unVal.pTable != (SQTable *)0x0) {
        pSVar1 = &((local_50.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
        local_40.super_SQObject._type = OT_INTEGER;
        local_40.super_SQObject._unVal.nInteger = 0x110;
        SQTable::NewSlot(pSVar2,&local_50,&local_40);
        SQObjectPtr::~SQObjectPtr(&local_40);
        SQObjectPtr::~SQObjectPtr(&local_50);
        pSVar2 = this->_keywords;
        local_50.super_SQObject._unVal.pString = SQString::Create(ss,"else",-1);
        local_50.super_SQObject._type = OT_STRING;
        if (local_50.super_SQObject._unVal.pTable != (SQTable *)0x0) {
          pSVar1 = &((local_50.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
                    .super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
          local_40.super_SQObject._type = OT_INTEGER;
          local_40.super_SQObject._unVal.nInteger = 0x111;
          SQTable::NewSlot(pSVar2,&local_50,&local_40);
          SQObjectPtr::~SQObjectPtr(&local_40);
          SQObjectPtr::~SQObjectPtr(&local_50);
          pSVar2 = this->_keywords;
          local_50.super_SQObject._unVal.pString = SQString::Create(ss,"break",-1);
          local_50.super_SQObject._type = OT_STRING;
          if (local_50.super_SQObject._unVal.pTable != (SQTable *)0x0) {
            pSVar1 = &((local_50.super_SQObject._unVal.pTable)->super_SQDelegable).
                      super_SQCollectable.super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 + 1;
            local_40.super_SQObject._type = OT_INTEGER;
            local_40.super_SQObject._unVal.nInteger = 0x113;
            SQTable::NewSlot(pSVar2,&local_50,&local_40);
            SQObjectPtr::~SQObjectPtr(&local_40);
            SQObjectPtr::~SQObjectPtr(&local_50);
            pSVar2 = this->_keywords;
            local_50.super_SQObject._unVal.pString = SQString::Create(ss,"continue",-1);
            local_50.super_SQObject._type = OT_STRING;
            if (local_50.super_SQObject._unVal.pTable != (SQTable *)0x0) {
              pSVar1 = &((local_50.super_SQObject._unVal.pTable)->super_SQDelegable).
                        super_SQCollectable.super_SQRefCounted._uiRef;
              *pSVar1 = *pSVar1 + 1;
              local_40.super_SQObject._type = OT_INTEGER;
              local_40.super_SQObject._unVal.nInteger = 0x123;
              SQTable::NewSlot(pSVar2,&local_50,&local_40);
              SQObjectPtr::~SQObjectPtr(&local_40);
              SQObjectPtr::~SQObjectPtr(&local_50);
              pSVar2 = this->_keywords;
              local_50.super_SQObject._unVal.pString = SQString::Create(ss,"return",-1);
              local_50.super_SQObject._type = OT_STRING;
              if (local_50.super_SQObject._unVal.pTable != (SQTable *)0x0) {
                pSVar1 = &((local_50.super_SQObject._unVal.pTable)->super_SQDelegable).
                          super_SQCollectable.super_SQRefCounted._uiRef;
                *pSVar1 = *pSVar1 + 1;
                local_40.super_SQObject._type = OT_INTEGER;
                local_40.super_SQObject._unVal.nInteger = 0x11e;
                SQTable::NewSlot(pSVar2,&local_50,&local_40);
                SQObjectPtr::~SQObjectPtr(&local_40);
                SQObjectPtr::~SQObjectPtr(&local_50);
                pSVar2 = this->_keywords;
                local_50.super_SQObject._unVal.pString = SQString::Create(ss,"null",-1);
                local_50.super_SQObject._type = OT_STRING;
                if (local_50.super_SQObject._unVal.pTable != (SQTable *)0x0) {
                  pSVar1 = &((local_50.super_SQObject._unVal.pTable)->super_SQDelegable).
                            super_SQCollectable.super_SQRefCounted._uiRef;
                  *pSVar1 = *pSVar1 + 1;
                  local_40.super_SQObject._type = OT_INTEGER;
                  local_40.super_SQObject._unVal.nInteger = 0x116;
                  SQTable::NewSlot(pSVar2,&local_50,&local_40);
                  SQObjectPtr::~SQObjectPtr(&local_40);
                  SQObjectPtr::~SQObjectPtr(&local_50);
                  pSVar2 = this->_keywords;
                  local_50.super_SQObject._unVal.pString = SQString::Create(ss,"function",-1);
                  local_50.super_SQObject._type = OT_STRING;
                  if (local_50.super_SQObject._unVal.pTable != (SQTable *)0x0) {
                    pSVar1 = &((local_50.super_SQObject._unVal.pTable)->super_SQDelegable).
                              super_SQCollectable.super_SQRefCounted._uiRef;
                    *pSVar1 = *pSVar1 + 1;
                    local_40.super_SQObject._type = OT_INTEGER;
                    local_40.super_SQObject._unVal.nInteger = 0x11d;
                    SQTable::NewSlot(pSVar2,&local_50,&local_40);
                    SQObjectPtr::~SQObjectPtr(&local_40);
                    SQObjectPtr::~SQObjectPtr(&local_50);
                    pSVar2 = this->_keywords;
                    local_50.super_SQObject._unVal.pString = SQString::Create(ss,"local",-1);
                    local_50.super_SQObject._type = OT_STRING;
                    if (local_50.super_SQObject._unVal.pTable != (SQTable *)0x0) {
                      pSVar1 = &((local_50.super_SQObject._unVal.pTable)->super_SQDelegable).
                                super_SQCollectable.super_SQRefCounted._uiRef;
                      *pSVar1 = *pSVar1 + 1;
                      local_40.super_SQObject._type = OT_INTEGER;
                      local_40.super_SQObject._unVal.nInteger = 0x11b;
                      SQTable::NewSlot(pSVar2,&local_50,&local_40);
                      SQObjectPtr::~SQObjectPtr(&local_40);
                      SQObjectPtr::~SQObjectPtr(&local_50);
                      pSVar2 = this->_keywords;
                      local_50.super_SQObject._unVal.pString = SQString::Create(ss,"for",-1);
                      local_50.super_SQObject._type = OT_STRING;
                      if (local_50.super_SQObject._unVal.pTable != (SQTable *)0x0) {
                        pSVar1 = &((local_50.super_SQObject._unVal.pTable)->super_SQDelegable).
                                  super_SQCollectable.super_SQRefCounted._uiRef;
                        *pSVar1 = *pSVar1 + 1;
                        local_40.super_SQObject._type = OT_INTEGER;
                        local_40.super_SQObject._unVal.nInteger = 0x114;
                        SQTable::NewSlot(pSVar2,&local_50,&local_40);
                        SQObjectPtr::~SQObjectPtr(&local_40);
                        SQObjectPtr::~SQObjectPtr(&local_50);
                        pSVar2 = this->_keywords;
                        local_50.super_SQObject._unVal.pString = SQString::Create(ss,"foreach",-1);
                        local_50.super_SQObject._type = OT_STRING;
                        if (local_50.super_SQObject._unVal.pTable != (SQTable *)0x0) {
                          pSVar1 = &((local_50.super_SQObject._unVal.pTable)->super_SQDelegable).
                                    super_SQCollectable.super_SQRefCounted._uiRef;
                          *pSVar1 = *pSVar1 + 1;
                          local_40.super_SQObject._type = OT_INTEGER;
                          local_40.super_SQObject._unVal.nInteger = 0x117;
                          SQTable::NewSlot(pSVar2,&local_50,&local_40);
                          SQObjectPtr::~SQObjectPtr(&local_40);
                          SQObjectPtr::~SQObjectPtr(&local_50);
                          pSVar2 = this->_keywords;
                          local_50.super_SQObject._unVal.pString = SQString::Create(ss,"in",-1);
                          local_50.super_SQObject._type = OT_STRING;
                          if (local_50.super_SQObject._unVal.pTable != (SQTable *)0x0) {
                            pSVar1 = &((local_50.super_SQObject._unVal.pTable)->super_SQDelegable).
                                      super_SQCollectable.super_SQRefCounted._uiRef;
                            *pSVar1 = *pSVar1 + 1;
                            local_40.super_SQObject._type = OT_INTEGER;
                            local_40.super_SQObject._unVal.nInteger = 0x118;
                            SQTable::NewSlot(pSVar2,&local_50,&local_40);
                            SQObjectPtr::~SQObjectPtr(&local_40);
                            SQObjectPtr::~SQObjectPtr(&local_50);
                            pSVar2 = this->_keywords;
                            local_50.super_SQObject._unVal.pString =
                                 SQString::Create(ss,"typeof",-1);
                            local_50.super_SQObject._type = OT_STRING;
                            if (local_50.super_SQObject._unVal.pTable != (SQTable *)0x0) {
                              pSVar1 = &((local_50.super_SQObject._unVal.pTable)->super_SQDelegable)
                                        .super_SQCollectable.super_SQRefCounted._uiRef;
                              *pSVar1 = *pSVar1 + 1;
                              local_40.super_SQObject._type = OT_INTEGER;
                              local_40.super_SQObject._unVal.nInteger = 0x11f;
                              SQTable::NewSlot(pSVar2,&local_50,&local_40);
                              SQObjectPtr::~SQObjectPtr(&local_40);
                              SQObjectPtr::~SQObjectPtr(&local_50);
                              pSVar2 = this->_keywords;
                              local_50.super_SQObject._unVal.pString =
                                   SQString::Create(ss,"base",-1);
                              local_50.super_SQObject._type = OT_STRING;
                              if (local_50.super_SQObject._unVal.pTable != (SQTable *)0x0) {
                                pSVar1 = &((local_50.super_SQObject._unVal.pTable)->
                                          super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                                          _uiRef;
                                *pSVar1 = *pSVar1 + 1;
                                local_40.super_SQObject._type = OT_INTEGER;
                                local_40.super_SQObject._unVal.nInteger = 0x106;
                                SQTable::NewSlot(pSVar2,&local_50,&local_40);
                                SQObjectPtr::~SQObjectPtr(&local_40);
                                SQObjectPtr::~SQObjectPtr(&local_50);
                                pSVar2 = this->_keywords;
                                local_50.super_SQObject._unVal.pString =
                                     SQString::Create(ss,"delete",-1);
                                local_50.super_SQObject._type = OT_STRING;
                                if (local_50.super_SQObject._unVal.pTable != (SQTable *)0x0) {
                                  pSVar1 = &((local_50.super_SQObject._unVal.pTable)->
                                            super_SQDelegable).super_SQCollectable.
                                            super_SQRefCounted._uiRef;
                                  *pSVar1 = *pSVar1 + 1;
                                  local_40.super_SQObject._type = OT_INTEGER;
                                  local_40.super_SQObject._unVal.nInteger = 0x107;
                                  SQTable::NewSlot(pSVar2,&local_50,&local_40);
                                  SQObjectPtr::~SQObjectPtr(&local_40);
                                  SQObjectPtr::~SQObjectPtr(&local_50);
                                  pSVar2 = this->_keywords;
                                  local_50.super_SQObject._unVal.pString =
                                       SQString::Create(ss,"try",-1);
                                  local_50.super_SQObject._type = OT_STRING;
                                  if (local_50.super_SQObject._unVal.pTable != (SQTable *)0x0) {
                                    pSVar1 = &((local_50.super_SQObject._unVal.pTable)->
                                              super_SQDelegable).super_SQCollectable.
                                              super_SQRefCounted._uiRef;
                                    *pSVar1 = *pSVar1 + 1;
                                    local_40.super_SQObject._type = OT_INTEGER;
                                    local_40.super_SQObject._unVal.nInteger = 0x125;
                                    SQTable::NewSlot(pSVar2,&local_50,&local_40);
                                    SQObjectPtr::~SQObjectPtr(&local_40);
                                    SQObjectPtr::~SQObjectPtr(&local_50);
                                    pSVar2 = this->_keywords;
                                    local_50.super_SQObject._unVal.pString =
                                         SQString::Create(ss,"catch",-1);
                                    local_50.super_SQObject._type = OT_STRING;
                                    if (local_50.super_SQObject._unVal.pTable != (SQTable *)0x0) {
                                      pSVar1 = &((local_50.super_SQObject._unVal.pTable)->
                                                super_SQDelegable).super_SQCollectable.
                                                super_SQRefCounted._uiRef;
                                      *pSVar1 = *pSVar1 + 1;
                                      local_40.super_SQObject._type = OT_INTEGER;
                                      local_40.super_SQObject._unVal.nInteger = 0x126;
                                      SQTable::NewSlot(pSVar2,&local_50,&local_40);
                                      SQObjectPtr::~SQObjectPtr(&local_40);
                                      SQObjectPtr::~SQObjectPtr(&local_50);
                                      pSVar2 = this->_keywords;
                                      local_50.super_SQObject._unVal.pString =
                                           SQString::Create(ss,"throw",-1);
                                      local_50.super_SQObject._type = OT_STRING;
                                      if (local_50.super_SQObject._unVal.pTable != (SQTable *)0x0) {
                                        pSVar1 = &((local_50.super_SQObject._unVal.pTable)->
                                                  super_SQDelegable).super_SQCollectable.
                                                  super_SQRefCounted._uiRef;
                                        *pSVar1 = *pSVar1 + 1;
                                        local_40.super_SQObject._type = OT_INTEGER;
                                        local_40.super_SQObject._unVal.nInteger = 0x127;
                                        SQTable::NewSlot(pSVar2,&local_50,&local_40);
                                        SQObjectPtr::~SQObjectPtr(&local_40);
                                        SQObjectPtr::~SQObjectPtr(&local_50);
                                        pSVar2 = this->_keywords;
                                        local_50.super_SQObject._unVal.pString =
                                             SQString::Create(ss,"clone",-1);
                                        local_50.super_SQObject._type = OT_STRING;
                                        if (local_50.super_SQObject._unVal.pTable != (SQTable *)0x0)
                                        {
                                          pSVar1 = &((local_50.super_SQObject._unVal.pTable)->
                                                    super_SQDelegable).super_SQCollectable.
                                                    super_SQRefCounted._uiRef;
                                          *pSVar1 = *pSVar1 + 1;
                                          local_40.super_SQObject._type = OT_INTEGER;
                                          local_40.super_SQObject._unVal.nInteger = 0x11c;
                                          SQTable::NewSlot(pSVar2,&local_50,&local_40);
                                          SQObjectPtr::~SQObjectPtr(&local_40);
                                          SQObjectPtr::~SQObjectPtr(&local_50);
                                          pSVar2 = this->_keywords;
                                          local_50.super_SQObject._unVal.pString =
                                               SQString::Create(ss,"yield",-1);
                                          local_50.super_SQObject._type = OT_STRING;
                                          if (local_50.super_SQObject._unVal.pTable !=
                                              (SQTable *)0x0) {
                                            pSVar1 = &((local_50.super_SQObject._unVal.pTable)->
                                                      super_SQDelegable).super_SQCollectable.
                                                      super_SQRefCounted._uiRef;
                                            *pSVar1 = *pSVar1 + 1;
                                            local_40.super_SQObject._type = OT_INTEGER;
                                            local_40.super_SQObject._unVal.nInteger = 0x124;
                                            SQTable::NewSlot(pSVar2,&local_50,&local_40);
                                            SQObjectPtr::~SQObjectPtr(&local_40);
                                            SQObjectPtr::~SQObjectPtr(&local_50);
                                            pSVar2 = this->_keywords;
                                            local_50.super_SQObject._unVal.pString =
                                                 SQString::Create(ss,"resume",-1);
                                            local_50.super_SQObject._type = OT_STRING;
                                            if (local_50.super_SQObject._unVal.pTable !=
                                                (SQTable *)0x0) {
                                              pSVar1 = &((local_50.super_SQObject._unVal.pTable)->
                                                        super_SQDelegable).super_SQCollectable.
                                                        super_SQRefCounted._uiRef;
                                              *pSVar1 = *pSVar1 + 1;
                                              local_40.super_SQObject._type = OT_INTEGER;
                                              local_40.super_SQObject._unVal.nInteger = 0x12a;
                                              SQTable::NewSlot(pSVar2,&local_50,&local_40);
                                              SQObjectPtr::~SQObjectPtr(&local_40);
                                              SQObjectPtr::~SQObjectPtr(&local_50);
                                              pSVar2 = this->_keywords;
                                              local_50.super_SQObject._unVal.pString =
                                                   SQString::Create(ss,"switch",-1);
                                              local_50.super_SQObject._type = OT_STRING;
                                              if (local_50.super_SQObject._unVal.pTable !=
                                                  (SQTable *)0x0) {
                                                pSVar1 = &((local_50.super_SQObject._unVal.pTable)->
                                                          super_SQDelegable).super_SQCollectable.
                                                          super_SQRefCounted._uiRef;
                                                *pSVar1 = *pSVar1 + 1;
                                                local_40.super_SQObject._type = OT_INTEGER;
                                                local_40.super_SQObject._unVal.nInteger = 0x10c;
                                                SQTable::NewSlot(pSVar2,&local_50,&local_40);
                                                SQObjectPtr::~SQObjectPtr(&local_40);
                                                SQObjectPtr::~SQObjectPtr(&local_50);
                                                pSVar2 = this->_keywords;
                                                local_50.super_SQObject._unVal.pString =
                                                     SQString::Create(ss,"case",-1);
                                                local_50.super_SQObject._type = OT_STRING;
                                                if (local_50.super_SQObject._unVal.pTable !=
                                                    (SQTable *)0x0) {
                                                  pSVar1 = &((local_50.super_SQObject._unVal.pTable)
                                                            ->super_SQDelegable).super_SQCollectable
                                                            .super_SQRefCounted._uiRef;
                                                  *pSVar1 = *pSVar1 + 1;
                                                  local_40.super_SQObject._type = OT_INTEGER;
                                                  local_40.super_SQObject._unVal.nInteger = 300;
                                                  SQTable::NewSlot(pSVar2,&local_50,&local_40);
                                                  SQObjectPtr::~SQObjectPtr(&local_40);
                                                  SQObjectPtr::~SQObjectPtr(&local_50);
                                                  pSVar2 = this->_keywords;
                                                  local_50.super_SQObject._unVal.pString =
                                                       SQString::Create(ss,"default",-1);
                                                  local_50.super_SQObject._type = OT_STRING;
                                                  if (local_50.super_SQObject._unVal.pTable !=
                                                      (SQTable *)0x0) {
                                                    pSVar1 = &((local_50.super_SQObject._unVal.
                                                               pTable)->super_SQDelegable).
                                                              super_SQCollectable.super_SQRefCounted
                                                              ._uiRef;
                                                    *pSVar1 = *pSVar1 + 1;
                                                    local_40.super_SQObject._type = OT_INTEGER;
                                                    local_40.super_SQObject._unVal.nInteger = 0x12d;
                                                    SQTable::NewSlot(pSVar2,&local_50,&local_40);
                                                    SQObjectPtr::~SQObjectPtr(&local_40);
                                                    SQObjectPtr::~SQObjectPtr(&local_50);
                                                    pSVar2 = this->_keywords;
                                                    local_50.super_SQObject._unVal.pString =
                                                         SQString::Create(ss,"this",-1);
                                                    local_50.super_SQObject._type = OT_STRING;
                                                    if (local_50.super_SQObject._unVal.pTable !=
                                                        (SQTable *)0x0) {
                                                      pSVar1 = &((local_50.super_SQObject._unVal.
                                                                 pTable)->super_SQDelegable).
                                                                super_SQCollectable.
                                                                super_SQRefCounted._uiRef;
                                                      *pSVar1 = *pSVar1 + 1;
                                                      local_40.super_SQObject._type = OT_INTEGER;
                                                      local_40.super_SQObject._unVal.nInteger =
                                                           0x12e;
                                                      SQTable::NewSlot(pSVar2,&local_50,&local_40);
                                                      SQObjectPtr::~SQObjectPtr(&local_40);
                                                      SQObjectPtr::~SQObjectPtr(&local_50);
                                                      pSVar2 = this->_keywords;
                                                      local_50.super_SQObject._unVal.pString =
                                                           SQString::Create(ss,"class",-1);
                                                      local_50.super_SQObject._type = OT_STRING;
                                                      if (local_50.super_SQObject._unVal.pTable !=
                                                          (SQTable *)0x0) {
                                                        pSVar1 = &((local_50.super_SQObject._unVal.
                                                                   pTable)->super_SQDelegable).
                                                                  super_SQCollectable.
                                                                  super_SQRefCounted._uiRef;
                                                        *pSVar1 = *pSVar1 + 1;
                                                        local_40.super_SQObject._type = OT_INTEGER;
                                                        local_40.super_SQObject._unVal.nInteger =
                                                             0x133;
                                                        SQTable::NewSlot(pSVar2,&local_50,&local_40)
                                                        ;
                                                        SQObjectPtr::~SQObjectPtr(&local_40);
                                                        SQObjectPtr::~SQObjectPtr(&local_50);
                                                        pSVar2 = this->_keywords;
                                                        local_50.super_SQObject._unVal.pString =
                                                             SQString::Create(ss,"extends",-1);
                                                        local_50.super_SQObject._type = OT_STRING;
                                                        if (local_50.super_SQObject._unVal.pTable !=
                                                            (SQTable *)0x0) {
                                                          pSVar1 = &((local_50.super_SQObject._unVal
                                                                     .pTable)->super_SQDelegable).
                                                                    super_SQCollectable.
                                                                    super_SQRefCounted._uiRef;
                                                          *pSVar1 = *pSVar1 + 1;
                                                          local_40.super_SQObject._type = OT_INTEGER
                                                          ;
                                                          local_40.super_SQObject._unVal.nInteger =
                                                               0x134;
                                                          SQTable::NewSlot(pSVar2,&local_50,
                                                                           &local_40);
                                                          SQObjectPtr::~SQObjectPtr(&local_40);
                                                          SQObjectPtr::~SQObjectPtr(&local_50);
                                                          pSVar2 = this->_keywords;
                                                          local_50.super_SQObject._unVal.pString =
                                                               SQString::Create(ss,"constructor",-1)
                                                          ;
                                                          local_50.super_SQObject._type = OT_STRING;
                                                          if (local_50.super_SQObject._unVal.pTable
                                                              != (SQTable *)0x0) {
                                                            pSVar1 = &((local_50.super_SQObject.
                                                                        _unVal.pTable)->
                                                                      super_SQDelegable).
                                                                      super_SQCollectable.
                                                                      super_SQRefCounted._uiRef;
                                                            *pSVar1 = *pSVar1 + 1;
                                                            local_40.super_SQObject._type =
                                                                 OT_INTEGER;
                                                            local_40.super_SQObject._unVal.nInteger
                                                                 = 0x136;
                                                            SQTable::NewSlot(pSVar2,&local_50,
                                                                             &local_40);
                                                            SQObjectPtr::~SQObjectPtr(&local_40);
                                                            SQObjectPtr::~SQObjectPtr(&local_50);
                                                            pSVar2 = this->_keywords;
                                                            local_50.super_SQObject._unVal.pString =
                                                                 SQString::Create(ss,"instanceof",-1
                                                                                 );
                                                            local_50.super_SQObject._type =
                                                                 OT_STRING;
                                                            if (local_50.super_SQObject._unVal.
                                                                pTable != (SQTable *)0x0) {
                                                              pSVar1 = &((local_50.super_SQObject.
                                                                          _unVal.pTable)->
                                                                        super_SQDelegable).
                                                                        super_SQCollectable.
                                                                        super_SQRefCounted._uiRef;
                                                              *pSVar1 = *pSVar1 + 1;
                                                              local_40.super_SQObject._type =
                                                                   OT_INTEGER;
                                                              local_40.super_SQObject._unVal.
                                                              nInteger = 0x137;
                                                              SQTable::NewSlot(pSVar2,&local_50,
                                                                               &local_40);
                                                              SQObjectPtr::~SQObjectPtr(&local_40);
                                                              SQObjectPtr::~SQObjectPtr(&local_50);
                                                              pSVar2 = this->_keywords;
                                                              local_50.super_SQObject._unVal.pString
                                                                   = SQString::Create(ss,"true",-1);
                                                              local_50.super_SQObject._type =
                                                                   OT_STRING;
                                                              if (local_50.super_SQObject._unVal.
                                                                  pTable != (SQTable *)0x0) {
                                                                pSVar1 = &((local_50.super_SQObject.
                                                                            _unVal.pTable)->
                                                                          super_SQDelegable).
                                                                          super_SQCollectable.
                                                                          super_SQRefCounted._uiRef;
                                                                *pSVar1 = *pSVar1 + 1;
                                                                local_40.super_SQObject._type =
                                                                     OT_INTEGER;
                                                                local_40.super_SQObject._unVal.
                                                                nInteger = 0x13b;
                                                                SQTable::NewSlot(pSVar2,&local_50,
                                                                                 &local_40);
                                                                SQObjectPtr::~SQObjectPtr(&local_40)
                                                                ;
                                                                SQObjectPtr::~SQObjectPtr(&local_50)
                                                                ;
                                                                pSVar2 = this->_keywords;
                                                                local_50.super_SQObject._unVal.
                                                                pString = SQString::Create(ss,
                                                  "false",-1);
                                                  local_50.super_SQObject._type = OT_STRING;
                                                  if (local_50.super_SQObject._unVal.pTable !=
                                                      (SQTable *)0x0) {
                                                    pSVar1 = &((local_50.super_SQObject._unVal.
                                                               pTable)->super_SQDelegable).
                                                              super_SQCollectable.super_SQRefCounted
                                                              ._uiRef;
                                                    *pSVar1 = *pSVar1 + 1;
                                                    local_40.super_SQObject._type = OT_INTEGER;
                                                    local_40.super_SQObject._unVal.nInteger = 0x13c;
                                                    SQTable::NewSlot(pSVar2,&local_50,&local_40);
                                                    SQObjectPtr::~SQObjectPtr(&local_40);
                                                    SQObjectPtr::~SQObjectPtr(&local_50);
                                                    pSVar2 = this->_keywords;
                                                    local_50.super_SQObject._unVal.pString =
                                                         SQString::Create(ss,"static",-1);
                                                    local_50.super_SQObject._type = OT_STRING;
                                                    if (local_50.super_SQObject._unVal.pTable !=
                                                        (SQTable *)0x0) {
                                                      pSVar1 = &((local_50.super_SQObject._unVal.
                                                                 pTable)->super_SQDelegable).
                                                                super_SQCollectable.
                                                                super_SQRefCounted._uiRef;
                                                      *pSVar1 = *pSVar1 + 1;
                                                      local_40.super_SQObject._type = OT_INTEGER;
                                                      local_40.super_SQObject._unVal.nInteger =
                                                           0x142;
                                                      SQTable::NewSlot(pSVar2,&local_50,&local_40);
                                                      SQObjectPtr::~SQObjectPtr(&local_40);
                                                      SQObjectPtr::~SQObjectPtr(&local_50);
                                                      pSVar2 = this->_keywords;
                                                      local_50.super_SQObject._unVal.pString =
                                                           SQString::Create(ss,"enum",-1);
                                                      local_50.super_SQObject._type = OT_STRING;
                                                      if (local_50.super_SQObject._unVal.pTable !=
                                                          (SQTable *)0x0) {
                                                        pSVar1 = &((local_50.super_SQObject._unVal.
                                                                   pTable)->super_SQDelegable).
                                                                  super_SQCollectable.
                                                                  super_SQRefCounted._uiRef;
                                                        *pSVar1 = *pSVar1 + 1;
                                                        local_40.super_SQObject._type = OT_INTEGER;
                                                        local_40.super_SQObject._unVal.nInteger =
                                                             0x143;
                                                        SQTable::NewSlot(pSVar2,&local_50,&local_40)
                                                        ;
                                                        SQObjectPtr::~SQObjectPtr(&local_40);
                                                        SQObjectPtr::~SQObjectPtr(&local_50);
                                                        pSVar2 = this->_keywords;
                                                        local_50.super_SQObject._unVal.pString =
                                                             SQString::Create(ss,"const",-1);
                                                        local_50.super_SQObject._type = OT_STRING;
                                                        if (local_50.super_SQObject._unVal.pTable !=
                                                            (SQTable *)0x0) {
                                                          pSVar1 = &((local_50.super_SQObject._unVal
                                                                     .pTable)->super_SQDelegable).
                                                                    super_SQCollectable.
                                                                    super_SQRefCounted._uiRef;
                                                          *pSVar1 = *pSVar1 + 1;
                                                          local_40.super_SQObject._type = OT_INTEGER
                                                          ;
                                                          local_40.super_SQObject._unVal.nInteger =
                                                               0x144;
                                                          SQTable::NewSlot(pSVar2,&local_50,
                                                                           &local_40);
                                                          SQObjectPtr::~SQObjectPtr(&local_40);
                                                          SQObjectPtr::~SQObjectPtr(&local_50);
                                                          pSVar2 = this->_keywords;
                                                          local_50.super_SQObject._unVal.pString =
                                                               SQString::Create(ss,"__LINE__",-1);
                                                          local_50.super_SQObject._type = OT_STRING;
                                                          if (local_50.super_SQObject._unVal.pTable
                                                              != (SQTable *)0x0) {
                                                            pSVar1 = &((local_50.super_SQObject.
                                                                        _unVal.pTable)->
                                                                      super_SQDelegable).
                                                                      super_SQCollectable.
                                                                      super_SQRefCounted._uiRef;
                                                            *pSVar1 = *pSVar1 + 1;
                                                            local_40.super_SQObject._type =
                                                                 OT_INTEGER;
                                                            local_40.super_SQObject._unVal.nInteger
                                                                 = 0x139;
                                                            SQTable::NewSlot(pSVar2,&local_50,
                                                                             &local_40);
                                                            SQObjectPtr::~SQObjectPtr(&local_40);
                                                            SQObjectPtr::~SQObjectPtr(&local_50);
                                                            pSVar2 = this->_keywords;
                                                            local_50.super_SQObject._unVal.pString =
                                                                 SQString::Create(ss,"__FILE__",-1);
                                                            local_50.super_SQObject._type =
                                                                 OT_STRING;
                                                            if (local_50.super_SQObject._unVal.
                                                                pTable != (SQTable *)0x0) {
                                                              pSVar1 = &((local_50.super_SQObject.
                                                                          _unVal.pTable)->
                                                                        super_SQDelegable).
                                                                        super_SQCollectable.
                                                                        super_SQRefCounted._uiRef;
                                                              *pSVar1 = *pSVar1 + 1;
                                                              local_40.super_SQObject._type =
                                                                   OT_INTEGER;
                                                              local_40.super_SQObject._unVal.
                                                              nInteger = 0x13a;
                                                              SQTable::NewSlot(pSVar2,&local_50,
                                                                               &local_40);
                                                              SQObjectPtr::~SQObjectPtr(&local_40);
                                                              SQObjectPtr::~SQObjectPtr(&local_50);
                                                              pSVar2 = this->_keywords;
                                                              local_50.super_SQObject._unVal.pString
                                                                   = SQString::Create(ss,"rawcall",
                                                                                      -1);
                                                              local_50.super_SQObject._type =
                                                                   OT_STRING;
                                                              if (local_50.super_SQObject._unVal.
                                                                  pTable != (SQTable *)0x0) {
                                                                pSVar1 = &((local_50.super_SQObject.
                                                                            _unVal.pTable)->
                                                                          super_SQDelegable).
                                                                          super_SQCollectable.
                                                                          super_SQRefCounted._uiRef;
                                                                *pSVar1 = *pSVar1 + 1;
                                                                local_40.super_SQObject._type =
                                                                     OT_INTEGER;
                                                                local_40.super_SQObject._unVal.
                                                                nInteger = 0x145;
                                                                SQTable::NewSlot(pSVar2,&local_50,
                                                                                 &local_40);
                                                                SQObjectPtr::~SQObjectPtr(&local_40)
                                                                ;
                                                                SQObjectPtr::~SQObjectPtr(&local_50)
                                                                ;
                                                                this->_readf = rg;
                                                                this->_up = up;
                                                                this->_currentline = 1;
                                                                this->_lasttokenline = 1;
                                                                this->_currentcolumn = 0;
                                                                this->_prevtoken = -1;
                                                                this->_reached_eof = 0;
                                                                SVar3 = (*rg)(up);
                                                                if (0xff < SVar3) {
                                                                  (*this->_errfunc)(this->_errtarget
                                                                                    ,
                                                  "Invalid character");
                                                  }
                                                  if (SVar3 == 0) {
                                                    this->_currdata = '\0';
                                                    this->_reached_eof = 1;
                                                  }
                                                  else {
                                                    this->_currdata = (LexChar)SVar3;
                                                  }
                                                  return;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  local_50.super_SQObject._type = OT_STRING;
  __assert_fail("_unVal.pTable",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqobject.h"
                ,0xea,"SQObjectPtr::SQObjectPtr(SQString *)");
}

Assistant:

void SQLexer::Init(SQSharedState *ss, SQLEXREADFUNC rg, SQUserPointer up,CompilerErrorFunc efunc,void *ed)
{
    _errfunc = efunc;
    _errtarget = ed;
    _sharedstate = ss;
    _keywords = SQTable::Create(ss, 37);
    ADD_KEYWORD(while, TK_WHILE);
    ADD_KEYWORD(do, TK_DO);
    ADD_KEYWORD(if, TK_IF);
    ADD_KEYWORD(else, TK_ELSE);
    ADD_KEYWORD(break, TK_BREAK);
    ADD_KEYWORD(continue, TK_CONTINUE);
    ADD_KEYWORD(return, TK_RETURN);
    ADD_KEYWORD(null, TK_NULL);
    ADD_KEYWORD(function, TK_FUNCTION);
    ADD_KEYWORD(local, TK_LOCAL);
    ADD_KEYWORD(for, TK_FOR);
    ADD_KEYWORD(foreach, TK_FOREACH);
    ADD_KEYWORD(in, TK_IN);
    ADD_KEYWORD(typeof, TK_TYPEOF);
    ADD_KEYWORD(base, TK_BASE);
    ADD_KEYWORD(delete, TK_DELETE);
    ADD_KEYWORD(try, TK_TRY);
    ADD_KEYWORD(catch, TK_CATCH);
    ADD_KEYWORD(throw, TK_THROW);
    ADD_KEYWORD(clone, TK_CLONE);
    ADD_KEYWORD(yield, TK_YIELD);
    ADD_KEYWORD(resume, TK_RESUME);
    ADD_KEYWORD(switch, TK_SWITCH);
    ADD_KEYWORD(case, TK_CASE);
    ADD_KEYWORD(default, TK_DEFAULT);
    ADD_KEYWORD(this, TK_THIS);
    ADD_KEYWORD(class,TK_CLASS);
    ADD_KEYWORD(extends,TK_EXTENDS);
    ADD_KEYWORD(constructor,TK_CONSTRUCTOR);
    ADD_KEYWORD(instanceof,TK_INSTANCEOF);
    ADD_KEYWORD(true,TK_TRUE);
    ADD_KEYWORD(false,TK_FALSE);
    ADD_KEYWORD(static,TK_STATIC);
    ADD_KEYWORD(enum,TK_ENUM);
    ADD_KEYWORD(const,TK_CONST);
    ADD_KEYWORD(__LINE__,TK___LINE__);
    ADD_KEYWORD(__FILE__,TK___FILE__);
    ADD_KEYWORD(rawcall, TK_RAWCALL);


    _readf = rg;
    _up = up;
    _lasttokenline = _currentline = 1;
    _currentcolumn = 0;
    _prevtoken = -1;
    _reached_eof = SQFalse;
    Next();
}